

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O3

int tool_readbusy_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  int iVar2;
  timediff_t tVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  curltime cVar7;
  curltime newer;
  curltime older;
  
  lVar1 = *(long *)((long)clientp + 0x10);
  uVar4 = *(ulong *)(lVar1 + 0x4e4);
  if (((uint)uVar4 >> 0x1d & 1) != 0) {
    if (tool_readbusy_cb::ulprev == ulnow) {
      cVar7 = curlx_now();
      if (tool_readbusy_cb_prev_0 != 0) {
        lVar6 = tool_readbusy_cb::rate + 3;
        if (-1 < tool_readbusy_cb::rate) {
          lVar6 = tool_readbusy_cb::rate;
        }
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar7._0_12_,0);
        newer.tv_usec = SUB124(cVar7._0_12_,8);
        older.tv_usec = tool_readbusy_cb_prev_1;
        older.tv_sec = tool_readbusy_cb_prev_0;
        older._12_4_ = 0;
        tVar3 = curlx_timediff(newer,older);
        lVar5 = tVar3 + 3;
        if (-1 < tVar3) {
          lVar5 = tVar3;
        }
        tool_readbusy_cb::rate = ((lVar5 >> 2) - (lVar6 >> 2)) + tool_readbusy_cb::rate;
      }
      tool_readbusy_cb_prev_0 = cVar7.tv_sec;
      tool_readbusy_cb_prev_1 = cVar7.tv_usec;
      if (tool_readbusy_cb::rate < 0x32) {
        tool_go_sleep(0x19);
        goto LAB_0010c24a;
      }
      uVar4 = *(ulong *)(lVar1 + 0x4e4);
    }
    else {
      tool_readbusy_cb::rate = 0x32;
      tool_readbusy_cb::ulprev = ulnow;
    }
    *(ulong *)(lVar1 + 0x4e4) = uVar4 & 0xffffffffdfffffff;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
LAB_0010c24a:
  iVar2 = 0x10000001;
  if ((*(byte *)((long)clientp + 0x1d8) & 2) != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int tool_readbusy_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;

  (void)dltotal;  /* unused */
  (void)dlnow;  /* unused */
  (void)ultotal;  /* unused */
  (void)ulnow;  /* unused */

  if(config->readbusy) {
    /* lame code to keep the rate down because the input might not deliver
       anything, get paused again and come back here immediately */
    static timediff_t rate = 500;
    static struct curltime prev;
    static curl_off_t ulprev;

    if(ulprev == ulnow) {
      /* it did not upload anything since last call */
      struct curltime now = curlx_now();
      if(prev.tv_sec)
        /* get a rolling average rate */
        rate -= rate/4 - curlx_timediff(now, prev)/4;
      prev = now;
    }
    else {
      rate = 50;
      ulprev = ulnow;
    }
    if(rate >= 50) {
      /* keeps the looping down to 20 times per second in the crazy case */
      config->readbusy = FALSE;
      curl_easy_pause(per->curl, CURLPAUSE_CONT);
    }
    else
      /* sleep half a period */
      tool_go_sleep(25);
  }

  return per->noprogress ? 0 : CURL_PROGRESSFUNC_CONTINUE;
}